

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_write.cpp
# Opt level: O0

void __thiscall UniValue::writeArray(UniValue *this,uint prettyIndent,uint indentLevel,string *s)

{
  size_type sVar1;
  const_reference pvVar2;
  int in_EDX;
  uint in_ESI;
  long in_FS_OFFSET;
  uint i;
  uint in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  uint local_44;
  undefined8 local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80);
  if (in_ESI != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80);
  }
  local_44 = 0;
  while( true ) {
    sVar1 = std::vector<UniValue,_std::allocator<UniValue>_>::size
                      ((vector<UniValue,_std::allocator<UniValue>_> *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (sVar1 <= local_44) break;
    if (in_ESI != 0) {
      indentStr(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,(string *)0x28786a);
    }
    pvVar2 = std::vector<UniValue,_std::allocator<UniValue>_>::operator[]
                       ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_ffffffffffffff88,
                        (size_type)in_stack_ffffffffffffff80);
    write_abi_cxx11_((UniValue *)&stack0xffffffffffffffd8,(int)pvVar2,(void *)(ulong)in_ESI,
                     (ulong)(in_EDX + 1));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    in_stack_ffffffffffffff88 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)local_44;
    sVar1 = std::vector<UniValue,_std::allocator<UniValue>_>::size
                      ((vector<UniValue,_std::allocator<UniValue>_> *)
                       CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (in_stack_ffffffffffffff88 !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(sVar1 - 1)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80);
    }
    if (in_ESI != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80);
    }
    local_44 = local_44 + 1;
  }
  if (in_ESI != 0) {
    indentStr(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,(string *)0x287954);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UniValue::writeArray(unsigned int prettyIndent, unsigned int indentLevel, std::string& s) const
{
    s += "[";
    if (prettyIndent)
        s += "\n";

    for (unsigned int i = 0; i < values.size(); i++) {
        if (prettyIndent)
            indentStr(prettyIndent, indentLevel, s);
        s += values[i].write(prettyIndent, indentLevel + 1);
        if (i != (values.size() - 1)) {
            s += ",";
        }
        if (prettyIndent)
            s += "\n";
    }

    if (prettyIndent)
        indentStr(prettyIndent, indentLevel - 1, s);
    s += "]";
}